

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O3

boolean flush_bits(working_state *state)

{
  jpeg_destination_mgr *pjVar1;
  uint uVar2;
  boolean bVar3;
  size_t sVar4;
  byte bVar5;
  ulong uVar6;
  JOCTET *__dest;
  byte *pbVar7;
  byte *pbVar8;
  ulong uVar9;
  byte *__src;
  ulong uVar10;
  JOCTET _buffer [512];
  byte local_238 [520];
  
  __src = local_238;
  pbVar7 = local_238;
  uVar2 = 0x40 - (state->cur).free_bits;
  uVar9 = state->free_in_buffer;
  if (0x1ff < uVar9) {
    pbVar7 = state->next_output_byte;
  }
  uVar10 = (state->cur).put_buffer.c;
  if (7 < (int)uVar2) {
    uVar6 = (ulong)uVar2 + 8;
    do {
      bVar5 = (byte)(uVar10 >> ((char)uVar6 - 0x10U & 0x3f));
      *pbVar7 = bVar5;
      pbVar8 = pbVar7 + 1;
      pbVar7[1] = 0;
      pbVar7 = pbVar7 + 2;
      if (bVar5 != 0xff) {
        pbVar7 = pbVar8;
      }
      uVar6 = uVar6 - 8;
      uVar2 = uVar2 - 8;
    } while (0xf < uVar6);
  }
  pbVar8 = pbVar7;
  if (uVar2 != 0) {
    bVar5 = (byte)(uVar10 << (8 - (byte)uVar2 & 0x3f)) | (byte)(0xff >> ((byte)uVar2 & 0x1f));
    *pbVar7 = bVar5;
    pbVar7[1] = 0;
    pbVar8 = pbVar7 + 2;
    if (bVar5 != 0xff) {
      pbVar8 = pbVar7 + 1;
    }
  }
  (state->cur).put_buffer.c = 0;
  (state->cur).free_bits = 0x40;
  if (uVar9 < 0x200) {
    uVar9 = (long)pbVar8 - (long)local_238;
    if (uVar9 != 0) {
      __dest = state->next_output_byte;
      sVar4 = state->free_in_buffer;
      do {
        uVar10 = sVar4;
        if (uVar9 < sVar4) {
          uVar10 = uVar9;
        }
        memcpy(__dest,__src,uVar10);
        __dest = state->next_output_byte + uVar10;
        state->next_output_byte = __dest;
        sVar4 = state->free_in_buffer - uVar10;
        state->free_in_buffer = sVar4;
        if (sVar4 == 0) {
          pjVar1 = state->cinfo->dest;
          bVar3 = (*pjVar1->empty_output_buffer)(state->cinfo);
          if (bVar3 == 0) {
            return 0;
          }
          __dest = pjVar1->next_output_byte;
          state->next_output_byte = __dest;
          sVar4 = pjVar1->free_in_buffer;
          state->free_in_buffer = sVar4;
        }
        __src = __src + uVar10;
        uVar9 = uVar9 - uVar10;
      } while (uVar9 != 0);
    }
  }
  else {
    state->free_in_buffer =
         (size_t)(state->next_output_byte + (state->free_in_buffer - (long)pbVar8));
    state->next_output_byte = pbVar8;
  }
  return 1;
}

Assistant:

LOCAL(boolean)
flush_bits(working_state *state)
{
  JOCTET _buffer[BUFSIZE], *buffer, temp;
  simd_bit_buf_type put_buffer;  int put_bits;
  int localbuf = 0;

  if (state->simd) {
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    put_bits = state->cur.free_bits;
#else
    put_bits = SIMD_BIT_BUF_SIZE - state->cur.free_bits;
#endif
    put_buffer = state->cur.put_buffer.simd;
  } else {
    put_bits = BIT_BUF_SIZE - state->cur.free_bits;
    put_buffer = state->cur.put_buffer.c;
  }

  LOAD_BUFFER()

  while (put_bits >= 8) {
    put_bits -= 8;
    temp = (JOCTET)(put_buffer >> put_bits);
    EMIT_BYTE(temp)
  }
  if (put_bits) {
    /* fill partial byte with ones */
    temp = (JOCTET)((put_buffer << (8 - put_bits)) | (0xFF >> put_bits));
    EMIT_BYTE(temp)
  }

  if (state->simd) {                    /* and reset bit buffer to empty */
    state->cur.put_buffer.simd = 0;
#if defined(__aarch64__) && !defined(NEON_INTRINSICS)
    state->cur.free_bits = 0;
#else
    state->cur.free_bits = SIMD_BIT_BUF_SIZE;
#endif
  } else {
    state->cur.put_buffer.c = 0;
    state->cur.free_bits = BIT_BUF_SIZE;
  }
  STORE_BUFFER()

  return TRUE;
}